

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

uint __thiscall QLocale::toUInt(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  QSimpleParsedNumber<unsigned_long_long> QVar5;
  ulong uVar4;
  
  pQVar1 = (this->d).d.ptr;
  QVar5 = QLocaleData::stringToUnsLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar5.used;
  }
  bVar2 = QVar5.result >> 0x20 == 0;
  uVar4 = 0;
  if (bVar2) {
    uVar4 = QVar5.result;
  }
  uVar3 = (uint)uVar4;
  if (!bVar2 && ok != (bool *)0x0) {
    *ok = false;
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint QLocale::toUInt(QStringView s, bool *ok) const
{
    return toIntegral_helper<uint>(d, s, ok);
}